

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O0

void qDrawBorderPixmap(QPainter *painter,QRect *targetRect,QMargins *targetMargins,QPixmap *pixmap,
                      QRect *sourceRect,QMargins *sourceMargins,QTileRules *rules,DrawingHints hints
                      )

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Int IVar18;
  uint uVar19;
  int *piVar20;
  long *plVar21;
  reference pvVar22;
  reference pvVar23;
  size_type sVar24;
  PixmapFragment *pPVar25;
  ulong uVar26;
  QFlags_conflict1 *in_RCX;
  RenderHint RVar27;
  PixmapFragment *in_RDI;
  long in_FS_OFFSET;
  bool bVar28;
  double dVar29;
  double dVar30;
  int *in_stack_00000008;
  int i_7;
  int i_6;
  int j;
  qreal repeatHeight;
  qreal repeatWidth;
  QPixmapFragmentsArray *data_4;
  int i_5;
  QPixmapFragmentsArray *data_3;
  int i_4;
  QPixmapFragmentsArray *data_2;
  int i_3;
  QPixmapFragmentsArray *data_1;
  int i_2;
  QPixmapFragmentsArray *data;
  int i_1;
  int i;
  qreal dy;
  qreal dx;
  bool oldAA;
  int rows;
  int columns;
  int targetCenterHeight;
  int targetCenterWidth;
  int targetCenterRight;
  int targetCenterBottom;
  int targetCenterLeft;
  int targetCenterTop;
  int sourceCenterHeight;
  int sourceCenterWidth;
  int sourceCenterRight;
  int sourceCenterBottom;
  int sourceCenterLeft;
  int sourceCenterTop;
  PixmapFragment d;
  QVarLengthArray<double,_16LL> yTarget;
  QVarLengthArray<double,_16LL> xTarget;
  QPixmapFragmentsArray translucentData;
  QPixmapFragmentsArray opaqueData;
  QRect *in_stack_fffffffffffff028;
  PixmapFragmentHint flags;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *in_stack_fffffffffffff030;
  undefined4 in_stack_fffffffffffff038;
  undefined4 in_stack_fffffffffffff03c;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *local_f58;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *local_f20;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *local_ee8;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *local_eb0;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> *local_e78;
  int local_d3c;
  int local_d38;
  int local_d34;
  int local_d14;
  int local_d04;
  int local_cf4;
  int local_ce4;
  int local_cd8;
  int local_cd4;
  double local_cd0;
  double local_cc8;
  int local_cb8;
  int local_cb4;
  undefined1 local_c4c [8];
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c44;
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c40;
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c3c;
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c38;
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c34;
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c30;
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c2c;
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c28;
  QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4> local_c24;
  int local_c20 [3];
  int local_c14;
  double local_c10;
  double local_c08;
  double local_c00;
  double local_bf8;
  double local_bf0;
  double local_be8;
  double local_be0;
  double local_bd8;
  undefined8 local_bd0;
  undefined8 local_bc8;
  QVarLengthArray<double,_16LL> local_b68;
  QVarLengthArray<double,_16LL> local_ad0;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> local_a38;
  QVarLengthArray<QPainter::PixmapFragment,_16LL> local_520;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c10,0xff,0x50);
  local_bc8 = 0x3ff0000000000000;
  local_bd0 = 0;
  memset(&local_520,0xaa,0x518);
  QVarLengthArray<QPainter::PixmapFragment,_16LL>::QVarLengthArray(&local_520);
  memset(&local_a38,0xaa,0x518);
  QVarLengthArray<QPainter::PixmapFragment,_16LL>::QVarLengthArray(&local_a38);
  iVar3 = QRect::top((QRect *)0x3faacb);
  iVar4 = QMargins::top((QMargins *)0x3faadf);
  iVar3 = iVar3 + iVar4;
  iVar5 = QRect::left((QRect *)0x3faafe);
  iVar4 = QMargins::left((QMargins *)0x3fab12);
  iVar5 = iVar5 + iVar4;
  iVar4 = QRect::bottom((QRect *)0x3fab31);
  iVar6 = QMargins::bottom((QMargins *)0x3fab45);
  iVar4 = (iVar4 - iVar6) + 1;
  iVar6 = QRect::right((QRect *)0x3fab67);
  iVar7 = QMargins::right((QMargins *)0x3fab7b);
  iVar6 = (iVar6 - iVar7) + 1;
  iVar7 = iVar6 - iVar5;
  iVar8 = iVar4 - iVar3;
  iVar9 = QRect::top((QRect *)0x3fabc7);
  iVar10 = QMargins::top((QMargins *)0x3fabdb);
  iVar11 = QRect::left((QRect *)0x3fabfa);
  iVar12 = QMargins::left((QMargins *)0x3fac0e);
  iVar13 = QRect::bottom((QRect *)0x3fac2d);
  iVar14 = QMargins::bottom((QMargins *)0x3fac41);
  iVar13 = (iVar13 - iVar14) + 1;
  iVar14 = QRect::right((QRect *)0x3fac63);
  iVar15 = QMargins::right((QMargins *)0x3fac77);
  iVar14 = (iVar14 - iVar15) + 1;
  iVar15 = iVar14 - (iVar11 + iVar12);
  iVar16 = iVar13 - (iVar9 + iVar10);
  memset(&local_ad0,0xaa,0x98);
  QVarLengthArray<double,_16LL>::QVarLengthArray(&local_ad0);
  memset(&local_b68,0xaa,0x98);
  QVarLengthArray<double,_16LL>::QVarLengthArray(&local_b68);
  local_cb4 = 3;
  local_cb8 = 3;
  if ((*in_stack_00000008 != 0) && (iVar7 != 0)) {
    local_c14 = 3;
    local_c20[2] = qCeil<double>(2.061803627089e-317);
    local_c20[2] = local_c20[2] + 2;
    piVar20 = qMax<int>(&local_c14,local_c20 + 2);
    local_cb4 = *piVar20;
  }
  if ((in_stack_00000008[1] != 0) && (iVar8 != 0)) {
    local_c20[1] = 3;
    local_c20[0] = qCeil<double>(2.06185402178488e-317);
    local_c20[0] = local_c20[0] + 2;
    piVar20 = qMax<int>(local_c20 + 1,local_c20);
    local_cb8 = *piVar20;
  }
  QVarLengthArray<double,_16LL>::resize
            ((QVarLengthArray<double,_16LL> *)in_stack_fffffffffffff030,
             (qsizetype)in_stack_fffffffffffff028);
  QVarLengthArray<double,_16LL>::resize
            ((QVarLengthArray<double,_16LL> *)in_stack_fffffffffffff030,
             (qsizetype)in_stack_fffffffffffff028);
  bVar2 = QPainter::testRenderHint
                    ((QPainter *)in_stack_fffffffffffff030,
                     (RenderHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
  plVar21 = (long *)QPainter::paintEngine();
  iVar17 = (**(code **)(*plVar21 + 0xa8))();
  bVar28 = false;
  if (iVar17 != 6) {
    plVar21 = (long *)QPainter::paintEngine();
    iVar17 = (**(code **)(*plVar21 + 0xa8))();
    bVar28 = false;
    if ((iVar17 != 0xd) && (bVar28 = false, bVar2)) {
      QPainter::combinedTransform();
      iVar17 = QTransform::type();
      bVar28 = iVar17 != 0;
    }
  }
  RVar27 = (RenderHint)in_RDI;
  if (bVar28) {
    QPainter::setRenderHint(RVar27,true);
  }
  iVar17 = QRect::left((QRect *)0x3faef0);
  pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3faf1e);
  *pvVar22 = (double)iVar17;
  pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3faf57);
  *pvVar22 = (double)(iVar11 + iVar12);
  pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3faf8f);
  *pvVar22 = (double)iVar14;
  iVar11 = QRect::left((QRect *)0x3fafa9);
  iVar12 = QRect::width(in_stack_fffffffffffff028);
  pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fafea);
  *pvVar22 = (double)(iVar11 + iVar12);
  iVar11 = QRect::top((QRect *)0x3fb004);
  pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb02e);
  *pvVar22 = (double)iVar11;
  pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb062);
  *pvVar22 = (double)(iVar9 + iVar10);
  pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb09a);
  *pvVar22 = (double)iVar13;
  iVar9 = QRect::top((QRect *)0x3fb0b4);
  iVar10 = QRect::height(in_stack_fffffffffffff028);
  pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb0f5);
  *pvVar22 = (double)(iVar9 + iVar10);
  local_cc8 = (double)iVar15;
  local_cd0 = (double)iVar16;
  iVar9 = *in_stack_00000008;
  if (iVar9 == 0) {
    local_cc8 = (double)iVar15;
  }
  else if (iVar9 == 1) {
    local_cc8 = (double)iVar7;
  }
  else if (iVar9 == 2) {
    local_cc8 = (double)iVar15 / (double)(local_cb4 + -2);
  }
  for (local_cd4 = 2; local_cd4 < local_cb4 + -1; local_cd4 = local_cd4 + 1) {
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb1df);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb20a);
    *pvVar22 = dVar29 + local_cc8;
  }
  iVar9 = in_stack_00000008[1];
  if (iVar9 == 0) {
    local_cd0 = (double)iVar16;
  }
  else if (iVar9 == 1) {
    local_cd0 = (double)iVar8;
  }
  else if (iVar9 == 2) {
    local_cd0 = (double)iVar16 / (double)(local_cb8 + -2);
  }
  for (local_cd8 = 2; local_cd8 < local_cb8 + -1; local_cd8 = local_cd8 + 1) {
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb2e4);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb30f);
    *pvVar22 = dVar29 + local_cd0;
  }
  iVar9 = QMargins::top((QMargins *)0x3fb33c);
  if ((((0 < iVar9) && (iVar9 = QMargins::left((QMargins *)0x3fb352), 0 < iVar9)) &&
      (iVar9 = QMargins::top((QMargins *)0x3fb368), 0 < iVar9)) &&
     (iVar9 = QMargins::left((QMargins *)0x3fb37e), 0 < iVar9)) {
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb399);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb3b7);
    local_c10 = (dVar29 + *pvVar22) * 0.5;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb3eb);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb409);
    local_c08 = (dVar29 + *pvVar22) * 0.5;
    iVar9 = QRect::left((QRect *)0x3fb438);
    local_c00 = (double)iVar9;
    iVar9 = QRect::top((QRect *)0x3fb452);
    local_bf8 = (double)iVar9;
    iVar9 = QMargins::left((QMargins *)0x3fb46c);
    local_bf0 = (double)iVar9;
    iVar9 = QMargins::top((QMargins *)0x3fb486);
    local_be8 = (double)iVar9;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb4a5);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb4c3);
    local_be0 = (dVar29 - *pvVar22) / local_bf0;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb4f4);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb512);
    local_bd8 = (dVar29 - *pvVar22) / local_be8;
    local_c24.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
         (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
         QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                   ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                    (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
    IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c24);
    if (IVar18 == 0) {
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                 (PixmapFragment *)in_stack_fffffffffffff030);
    }
    else {
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                 (PixmapFragment *)in_stack_fffffffffffff030);
    }
  }
  iVar9 = QMargins::top((QMargins *)0x3fb597);
  if (((0 < iVar9) && (iVar9 = QMargins::right((QMargins *)0x3fb5ad), 0 < iVar9)) &&
     ((iVar9 = QMargins::top((QMargins *)0x3fb5c3), 0 < iVar9 &&
      (iVar9 = QMargins::right((QMargins *)0x3fb5d9), 0 < iVar9)))) {
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb5f7);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb61e);
    local_c10 = (dVar29 + *pvVar22) * 0.5;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb652);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb670);
    local_c08 = (dVar29 + *pvVar22) * 0.5;
    local_c00 = (double)iVar6;
    iVar9 = QRect::top((QRect *)0x3fb6b1);
    local_bf8 = (double)iVar9;
    iVar9 = QMargins::right((QMargins *)0x3fb6cb);
    local_bf0 = (double)iVar9;
    iVar9 = QMargins::top((QMargins *)0x3fb6e5);
    local_be8 = (double)iVar9;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb707);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb72e);
    local_be0 = (dVar29 - *pvVar22) / local_bf0;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb75f);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb77d);
    local_bd8 = (dVar29 - *pvVar22) / local_be8;
    local_c28.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
         (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
         QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                   ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                    (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
    IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c28);
    if (IVar18 == 0) {
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                 (PixmapFragment *)in_stack_fffffffffffff030);
    }
    else {
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                 (PixmapFragment *)in_stack_fffffffffffff030);
    }
  }
  iVar9 = QMargins::bottom((QMargins *)0x3fb802);
  if (((0 < iVar9) && (iVar9 = QMargins::left((QMargins *)0x3fb818), 0 < iVar9)) &&
     ((iVar9 = QMargins::bottom((QMargins *)0x3fb82e), 0 < iVar9 &&
      (iVar9 = QMargins::left((QMargins *)0x3fb844), 0 < iVar9)))) {
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb85f);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb87d);
    local_c10 = (dVar29 + *pvVar22) * 0.5;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb8b4);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb8db);
    local_c08 = (dVar29 + *pvVar22) * 0.5;
    iVar9 = QRect::left((QRect *)0x3fb90a);
    local_c00 = (double)iVar9;
    local_bf8 = (double)iVar4;
    iVar9 = QMargins::left((QMargins *)0x3fb936);
    local_bf0 = (double)iVar9;
    iVar9 = QMargins::bottom((QMargins *)0x3fb950);
    local_be8 = (double)iVar9;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb96f);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb98d);
    local_be0 = (dVar29 - *pvVar22) / local_bf0;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb9c1);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fb9e8);
    local_bd8 = (dVar29 - *pvVar22) / local_be8;
    local_c2c.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
         (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
         QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                   ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                    (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
    IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c2c);
    if (IVar18 == 0) {
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                 (PixmapFragment *)in_stack_fffffffffffff030);
    }
    else {
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                 (PixmapFragment *)in_stack_fffffffffffff030);
    }
  }
  iVar9 = QMargins::bottom((QMargins *)0x3fba6d);
  if ((((0 < iVar9) && (iVar9 = QMargins::right((QMargins *)0x3fba83), 0 < iVar9)) &&
      (iVar9 = QMargins::bottom((QMargins *)0x3fba99), 0 < iVar9)) &&
     (iVar9 = QMargins::right((QMargins *)0x3fbaaf), 0 < iVar9)) {
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbacd);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbaf4);
    local_c10 = (dVar29 + *pvVar22) * 0.5;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbb2b);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbb52);
    local_c08 = (dVar29 + *pvVar22) * 0.5;
    local_c00 = (double)iVar6;
    local_bf8 = (double)iVar4;
    iVar9 = QMargins::right((QMargins *)0x3fbba5);
    local_bf0 = (double)iVar9;
    iVar9 = QMargins::bottom((QMargins *)0x3fbbbf);
    local_be8 = (double)iVar9;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbbe1);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbc08);
    local_be0 = (dVar29 - *pvVar22) / local_bf0;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbc3c);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbc63);
    local_bd8 = (dVar29 - *pvVar22) / local_be8;
    local_c30.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
         (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
         QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                   ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                    (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
    IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c30);
    if (IVar18 == 0) {
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                 (PixmapFragment *)in_stack_fffffffffffff030);
    }
    else {
      QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                 CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                 (PixmapFragment *)in_stack_fffffffffffff030);
    }
  }
  if ((0 < iVar15) && (0 < iVar7)) {
    iVar9 = QMargins::top((QMargins *)0x3fbd04);
    if ((0 < iVar9) && (iVar9 = QMargins::top((QMargins *)0x3fbd1a), 0 < iVar9)) {
      local_c34.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
           (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
           QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                     ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                      (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
      IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c34);
      if (IVar18 == 0) {
        local_e78 = &local_a38;
      }
      else {
        local_e78 = &local_520;
      }
      local_c00 = (double)iVar5;
      iVar9 = QRect::top((QRect *)0x3fbdb3);
      local_bf8 = (double)iVar9;
      local_bf0 = (double)iVar7;
      iVar9 = QMargins::top((QMargins *)0x3fbddf);
      local_be8 = (double)iVar9;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbdfe)
      ;
      dVar29 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbe1c)
      ;
      local_c08 = (dVar29 + *pvVar22) * 0.5;
      local_be0 = local_cc8 / local_bf0;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbe6b)
      ;
      dVar29 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbe89)
      ;
      local_bd8 = (dVar29 - *pvVar22) / local_be8;
      for (local_ce4 = 1; local_ce4 < local_cb4 + -1; local_ce4 = local_ce4 + 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbee6);
        dVar29 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbf08);
        local_c10 = (dVar29 + *pvVar22) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                  ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                   CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                   (PixmapFragment *)in_stack_fffffffffffff030);
      }
      if (*in_stack_00000008 == 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbf80);
        dVar29 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fbfa7);
        dVar29 = (dVar29 - *pvVar22) / local_be0;
        QVLABaseBase::size((QVLABaseBase *)local_e78);
        pvVar23 = QVLABase<QPainter::PixmapFragment>::operator[]
                            ((QVLABase<QPainter::PixmapFragment> *)in_stack_fffffffffffff028,
                             0x3fbff7);
        pvVar23->width = dVar29;
      }
    }
    iVar9 = QMargins::bottom((QMargins *)0x3fc014);
    if ((0 < iVar9) && (iVar9 = QMargins::bottom((QMargins *)0x3fc02a), 0 < iVar9)) {
      local_c38.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
           (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
           QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                     ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                      (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
      IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c38);
      if (IVar18 == 0) {
        local_eb0 = &local_a38;
      }
      else {
        local_eb0 = &local_520;
      }
      local_c00 = (double)iVar5;
      local_bf8 = (double)iVar4;
      local_bf0 = (double)iVar7;
      iVar4 = QMargins::bottom((QMargins *)0x3fc0e7);
      local_be8 = (double)iVar4;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc109)
      ;
      dVar29 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc130)
      ;
      local_c08 = (dVar29 + *pvVar22) * 0.5;
      local_be0 = local_cc8 / local_bf0;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc182)
      ;
      dVar29 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc1a9)
      ;
      local_bd8 = (dVar29 - *pvVar22) / local_be8;
      for (local_cf4 = 1; local_cf4 < local_cb4 + -1; local_cf4 = local_cf4 + 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc206);
        dVar29 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc228);
        local_c10 = (dVar29 + *pvVar22) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                  ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                   CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                   (PixmapFragment *)in_stack_fffffffffffff030);
      }
      if (*in_stack_00000008 == 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc2a0);
        dVar29 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc2c7);
        dVar29 = (dVar29 - *pvVar22) / local_be0;
        QVLABaseBase::size((QVLABaseBase *)local_eb0);
        pvVar23 = QVLABase<QPainter::PixmapFragment>::operator[]
                            ((QVLABase<QPainter::PixmapFragment> *)in_stack_fffffffffffff028,
                             0x3fc317);
        pvVar23->width = dVar29;
      }
    }
  }
  if ((0 < iVar16) && (0 < iVar8)) {
    iVar4 = QMargins::left((QMargins *)0x3fc352);
    if ((0 < iVar4) && (iVar4 = QMargins::left((QMargins *)0x3fc368), 0 < iVar4)) {
      local_c3c.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
           (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
           QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                     ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                      (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
      IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c3c);
      if (IVar18 == 0) {
        local_ee8 = &local_a38;
      }
      else {
        local_ee8 = &local_520;
      }
      iVar4 = QRect::left((QRect *)0x3fc3ef);
      local_c00 = (double)iVar4;
      local_bf8 = (double)iVar3;
      iVar4 = QMargins::left((QMargins *)0x3fc41b);
      local_bf0 = (double)iVar4;
      local_be8 = (double)iVar8;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc44c)
      ;
      dVar29 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc46a)
      ;
      local_c10 = (dVar29 + *pvVar22) * 0.5;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc49e)
      ;
      dVar29 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc4bc)
      ;
      local_be0 = (dVar29 - *pvVar22) / local_bf0;
      local_bd8 = local_cd0 / local_be8;
      for (local_d04 = 1; local_d04 < local_cb8 + -1; local_d04 = local_d04 + 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc534);
        dVar29 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc556);
        local_c08 = (dVar29 + *pvVar22) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                  ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                   CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                   (PixmapFragment *)in_stack_fffffffffffff030);
      }
      if (in_stack_00000008[1] == 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc5cf);
        dVar29 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc5f6);
        dVar29 = (dVar29 - *pvVar22) / local_bd8;
        QVLABaseBase::size((QVLABaseBase *)local_ee8);
        pvVar23 = QVLABase<QPainter::PixmapFragment>::operator[]
                            ((QVLABase<QPainter::PixmapFragment> *)in_stack_fffffffffffff028,
                             0x3fc646);
        pvVar23->height = dVar29;
      }
    }
    iVar4 = QMargins::right((QMargins *)0x3fc663);
    if ((0 < iVar4) && (iVar4 = QMargins::right((QMargins *)0x3fc679), 0 < iVar4)) {
      local_c40.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
           (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
           QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                     ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                      (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
      IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c40);
      if (IVar18 == 0) {
        local_f20 = &local_a38;
      }
      else {
        local_f20 = &local_520;
      }
      local_c00 = (double)iVar6;
      local_bf8 = (double)iVar3;
      iVar4 = QMargins::right((QMargins *)0x3fc724);
      local_bf0 = (double)iVar4;
      local_be8 = (double)iVar8;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc758)
      ;
      dVar29 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc77f)
      ;
      local_c10 = (dVar29 + *pvVar22) * 0.5;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc7b6)
      ;
      dVar29 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc7dd)
      ;
      local_be0 = (dVar29 - *pvVar22) / local_bf0;
      local_bd8 = local_cd0 / local_be8;
      for (local_d14 = 1; local_d14 < local_cb8 + -1; local_d14 = local_d14 + 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc855);
        dVar29 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc877);
        local_c08 = (dVar29 + *pvVar22) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                  ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                   CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                   (PixmapFragment *)in_stack_fffffffffffff030);
      }
      if (in_stack_00000008[1] == 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc8f0);
        dVar29 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fc917);
        dVar29 = (dVar29 - *pvVar22) / local_bd8;
        QVLABaseBase::size((QVLABaseBase *)local_f20);
        pvVar23 = QVLABase<QPainter::PixmapFragment>::operator[]
                            ((QVLABase<QPainter::PixmapFragment> *)in_stack_fffffffffffff028,
                             0x3fc967);
        pvVar23->height = dVar29;
      }
    }
  }
  if ((((0 < iVar15) && (0 < iVar16)) && (0 < iVar7)) && (0 < iVar8)) {
    local_c44.super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i =
         (QFlagsStorage<QDrawBorderPixmap::DrawingHint>)
         QFlags<QDrawBorderPixmap::DrawingHint>::operator&
                   ((QFlags<QDrawBorderPixmap::DrawingHint> *)in_stack_fffffffffffff030,
                    (DrawingHint)((ulong)in_stack_fffffffffffff028 >> 0x20));
    IVar18 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c44);
    if (IVar18 == 0) {
      local_f58 = &local_a38;
    }
    else {
      local_f58 = &local_520;
    }
    local_c00 = (double)iVar5;
    local_bf8 = (double)iVar3;
    local_bf0 = (double)iVar7;
    local_be8 = (double)iVar8;
    local_be0 = local_cc8 / local_bf0;
    local_bd8 = local_cd0 / local_be8;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fcaba);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fcade);
    dVar30 = (dVar29 - *pvVar22) / local_be0;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fcb14);
    dVar29 = *pvVar22;
    pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fcb38);
    dVar29 = (dVar29 - *pvVar22) / local_bd8;
    for (local_d34 = 1; local_d34 < local_cb8 + -1; local_d34 = local_d34 + 1) {
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fcb92)
      ;
      dVar1 = *pvVar22;
      pvVar22 = QVLABase<double>::operator[]((QVLABase<double> *)in_stack_fffffffffffff028,0x3fcbb1)
      ;
      local_c08 = (dVar1 + *pvVar22) * 0.5;
      for (local_d38 = 1; local_d38 < local_cb4 + -1; local_d38 = local_d38 + 1) {
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fcc0e);
        dVar1 = *pvVar22;
        pvVar22 = QVLABase<double>::operator[]
                            ((QVLABase<double> *)in_stack_fffffffffffff028,0x3fcc2d);
        local_c10 = (dVar1 + *pvVar22) * 0.5;
        QVarLengthArray<QPainter::PixmapFragment,_16LL>::append
                  ((QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
                   CONCAT44(in_stack_fffffffffffff03c,in_stack_fffffffffffff038),
                   (PixmapFragment *)in_stack_fffffffffffff030);
      }
      if (*in_stack_00000008 == 1) {
        QVLABaseBase::size((QVLABaseBase *)local_f58);
        pvVar23 = QVLABase<QPainter::PixmapFragment>::operator[]
                            ((QVLABase<QPainter::PixmapFragment> *)in_stack_fffffffffffff028,
                             0x3fccbe);
        pvVar23->width = dVar30;
      }
    }
    if (in_stack_00000008[1] == 1) {
      for (local_d3c = 1; local_d3c < local_cb4 + -1; local_d3c = local_d3c + 1) {
        QVLABaseBase::size((QVLABaseBase *)local_f58);
        pvVar23 = QVLABase<QPainter::PixmapFragment>::operator[]
                            ((QVLABase<QPainter::PixmapFragment> *)in_stack_fffffffffffff028,
                             0x3fcd54);
        pvVar23->height = dVar29;
      }
    }
  }
  flags = (PixmapFragmentHint)((ulong)in_stack_fffffffffffff028 >> 0x20);
  sVar24 = QVLABaseBase::size((QVLABaseBase *)&local_520);
  if (sVar24 != 0) {
    pPVar25 = QVLABase<QPainter::PixmapFragment>::data
                        (&local_520.super_QVLABase<QPainter::PixmapFragment>);
    uVar26 = QVLABaseBase::size((QVLABaseBase *)&local_520);
    QFlags<QPainter::PixmapFragmentHint>::QFlags
              ((QFlags<QPainter::PixmapFragmentHint> *)in_stack_fffffffffffff030,flags);
    QPainter::drawPixmapFragments(in_RDI,(int)pPVar25,(QPixmap *)(uVar26 & 0xffffffff),in_RCX);
  }
  sVar24 = QVLABaseBase::size((QVLABaseBase *)&local_a38);
  if (sVar24 != 0) {
    in_stack_fffffffffffff030 =
         (QVarLengthArray<QPainter::PixmapFragment,_16LL> *)
         QVLABase<QPainter::PixmapFragment>::data
                   (&local_a38.super_QVLABase<QPainter::PixmapFragment>);
    sVar24 = QVLABaseBase::size((QVLABaseBase *)&local_a38);
    uVar19 = (uint)sVar24;
    memset(local_c4c,0,4);
    QFlags<QPainter::PixmapFragmentHint>::QFlags((QFlags<QPainter::PixmapFragmentHint> *)0x3fce68);
    QPainter::drawPixmapFragments
              (in_RDI,(int)in_stack_fffffffffffff030,(QPixmap *)(ulong)uVar19,in_RCX);
  }
  if (bVar2) {
    QPainter::setRenderHint(RVar27,true);
  }
  QVarLengthArray<double,_16LL>::~QVarLengthArray
            ((QVarLengthArray<double,_16LL> *)in_stack_fffffffffffff030);
  QVarLengthArray<double,_16LL>::~QVarLengthArray
            ((QVarLengthArray<double,_16LL> *)in_stack_fffffffffffff030);
  QVarLengthArray<QPainter::PixmapFragment,_16LL>::~QVarLengthArray(in_stack_fffffffffffff030);
  QVarLengthArray<QPainter::PixmapFragment,_16LL>::~QVarLengthArray(in_stack_fffffffffffff030);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qDrawBorderPixmap(QPainter *painter, const QRect &targetRect, const QMargins &targetMargins,
                       const QPixmap &pixmap, const QRect &sourceRect,const QMargins &sourceMargins,
                       const QTileRules &rules
#ifndef Q_QDOC
                       , QDrawBorderPixmap::DrawingHints hints
#endif
                       )
{
    QPainter::PixmapFragment d;
    d.opacity = 1.0;
    d.rotation = 0.0;

    QPixmapFragmentsArray opaqueData;
    QPixmapFragmentsArray translucentData;

    // source center
    const int sourceCenterTop = sourceRect.top() + sourceMargins.top();
    const int sourceCenterLeft = sourceRect.left() + sourceMargins.left();
    const int sourceCenterBottom = sourceRect.bottom() - sourceMargins.bottom() + 1;
    const int sourceCenterRight = sourceRect.right() - sourceMargins.right() + 1;
    const int sourceCenterWidth = sourceCenterRight - sourceCenterLeft;
    const int sourceCenterHeight = sourceCenterBottom - sourceCenterTop;
    // target center
    const int targetCenterTop = targetRect.top() + targetMargins.top();
    const int targetCenterLeft = targetRect.left() + targetMargins.left();
    const int targetCenterBottom = targetRect.bottom() - targetMargins.bottom() + 1;
    const int targetCenterRight = targetRect.right() - targetMargins.right() + 1;
    const int targetCenterWidth = targetCenterRight - targetCenterLeft;
    const int targetCenterHeight = targetCenterBottom - targetCenterTop;

    QVarLengthArray<qreal, 16> xTarget; // x-coordinates of target rectangles
    QVarLengthArray<qreal, 16> yTarget; // y-coordinates of target rectangles

    int columns = 3;
    int rows = 3;
    if (rules.horizontal != Qt::StretchTile && sourceCenterWidth != 0)
        columns = qMax(3, 2 + qCeil(targetCenterWidth / qreal(sourceCenterWidth)));
    if (rules.vertical != Qt::StretchTile && sourceCenterHeight != 0)
        rows = qMax(3, 2 + qCeil(targetCenterHeight / qreal(sourceCenterHeight)));

    xTarget.resize(columns + 1);
    yTarget.resize(rows + 1);

    bool oldAA = painter->testRenderHint(QPainter::Antialiasing);
    if (painter->paintEngine()->type() != QPaintEngine::OpenGL
        && painter->paintEngine()->type() != QPaintEngine::OpenGL2
        && oldAA && painter->combinedTransform().type() != QTransform::TxNone) {
        painter->setRenderHint(QPainter::Antialiasing, false);
    }

    xTarget[0] = targetRect.left();
    xTarget[1] = targetCenterLeft;
    xTarget[columns - 1] = targetCenterRight;
    xTarget[columns] = targetRect.left() + targetRect.width();

    yTarget[0] = targetRect.top();
    yTarget[1] = targetCenterTop;
    yTarget[rows - 1] = targetCenterBottom;
    yTarget[rows] = targetRect.top() + targetRect.height();

    qreal dx = targetCenterWidth;
    qreal dy = targetCenterHeight;

    switch (rules.horizontal) {
    case Qt::StretchTile:
        dx = targetCenterWidth;
        break;
    case Qt::RepeatTile:
        dx = sourceCenterWidth;
        break;
    case Qt::RoundTile:
        dx = targetCenterWidth / qreal(columns - 2);
        break;
    }

    for (int i = 2; i < columns - 1; ++i)
        xTarget[i] = xTarget[i - 1] + dx;

    switch (rules.vertical) {
    case Qt::StretchTile:
        dy = targetCenterHeight;
        break;
    case Qt::RepeatTile:
        dy = sourceCenterHeight;
        break;
    case Qt::RoundTile:
        dy = targetCenterHeight / qreal(rows - 2);
        break;
    }

    for (int i = 2; i < rows - 1; ++i)
        yTarget[i] = yTarget[i - 1] + dy;

    // corners
    if (targetMargins.top() > 0 && targetMargins.left() > 0 && sourceMargins.top() > 0 && sourceMargins.left() > 0) { // top left
        d.x = (0.5 * (xTarget[1] + xTarget[0]));
        d.y = (0.5 * (yTarget[1] + yTarget[0]));
        d.sourceLeft = sourceRect.left();
        d.sourceTop = sourceRect.top();
        d.width = sourceMargins.left();
        d.height = sourceMargins.top();
        d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
        d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueTopLeft)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.top() > 0 && targetMargins.right() > 0 && sourceMargins.top() > 0 && sourceMargins.right() > 0) { // top right
        d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
        d.y = (0.5 * (yTarget[1] + yTarget[0]));
        d.sourceLeft = sourceCenterRight;
        d.sourceTop = sourceRect.top();
        d.width = sourceMargins.right();
        d.height = sourceMargins.top();
        d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
        d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueTopRight)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.bottom() > 0 && targetMargins.left() > 0 && sourceMargins.bottom() > 0 && sourceMargins.left() > 0) { // bottom left
        d.x = (0.5 * (xTarget[1] + xTarget[0]));
        d.y =(0.5 * (yTarget[rows] + yTarget[rows - 1]));
        d.sourceLeft = sourceRect.left();
        d.sourceTop = sourceCenterBottom;
        d.width = sourceMargins.left();
        d.height = sourceMargins.bottom();
        d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
        d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueBottomLeft)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.bottom() > 0 && targetMargins.right() > 0 && sourceMargins.bottom() > 0 && sourceMargins.right() > 0) { // bottom right
        d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
        d.y = (0.5 * (yTarget[rows] + yTarget[rows - 1]));
        d.sourceLeft = sourceCenterRight;
        d.sourceTop = sourceCenterBottom;
        d.width = sourceMargins.right();
        d.height = sourceMargins.bottom();
        d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
        d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueBottomRight)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }

    // horizontal edges
    if (targetCenterWidth > 0 && sourceCenterWidth > 0) {
        if (targetMargins.top() > 0 && sourceMargins.top() > 0) { // top
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueTop ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterLeft;
            d.sourceTop = sourceRect.top();
            d.width = sourceCenterWidth;
            d.height = sourceMargins.top();
            d.y = (0.5 * (yTarget[1] + yTarget[0]));
            d.scaleX = dx / d.width;
            d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = ((xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX);
        }
        if (targetMargins.bottom() > 0 && sourceMargins.bottom() > 0) { // bottom
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueBottom ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterLeft;
            d.sourceTop = sourceCenterBottom;
            d.width = sourceCenterWidth;
            d.height = sourceMargins.bottom();
            d.y = (0.5 * (yTarget[rows] + yTarget[rows - 1]));
            d.scaleX = dx / d.width;
            d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = ((xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX);
        }
    }

    // vertical edges
    if (targetCenterHeight > 0 && sourceCenterHeight > 0) {
        if (targetMargins.left() > 0 && sourceMargins.left() > 0) { // left
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueLeft ? opaqueData : translucentData;
            d.sourceLeft = sourceRect.left();
            d.sourceTop = sourceCenterTop;
            d.width = sourceMargins.left();
            d.height = sourceCenterHeight;
            d.x = (0.5 * (xTarget[1] + xTarget[0]));
            d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
            d.scaleY = dy / d.height;
            for (int i = 1; i < rows - 1; ++i) {
                d.y = (0.5 * (yTarget[i + 1] + yTarget[i]));
                data.append(d);
            }
            if (rules.vertical == Qt::RepeatTile)
                data[data.size() - 1].height = ((yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY);
        }
        if (targetMargins.right() > 0 && sourceMargins.right() > 0) { // right
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueRight ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterRight;
            d.sourceTop = sourceCenterTop;
            d.width = sourceMargins.right();
            d.height = sourceCenterHeight;
            d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
            d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
            d.scaleY = dy / d.height;
            for (int i = 1; i < rows - 1; ++i) {
                d.y = (0.5 * (yTarget[i + 1] + yTarget[i]));
                data.append(d);
            }
            if (rules.vertical == Qt::RepeatTile)
                data[data.size() - 1].height = ((yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY);
        }
    }

    // center
    if (targetCenterWidth > 0 && targetCenterHeight > 0 && sourceCenterWidth > 0 && sourceCenterHeight > 0) {
        QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueCenter ? opaqueData : translucentData;
        d.sourceLeft = sourceCenterLeft;
        d.sourceTop = sourceCenterTop;
        d.width = sourceCenterWidth;
        d.height = sourceCenterHeight;
        d.scaleX = dx / d.width;
        d.scaleY = dy / d.height;

        qreal repeatWidth = (xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX;
        qreal repeatHeight = (yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY;

        for (int j = 1; j < rows - 1; ++j) {
            d.y = (0.5 * (yTarget[j + 1] + yTarget[j]));
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = repeatWidth;
        }
        if (rules.vertical == Qt::RepeatTile) {
            for (int i = 1; i < columns - 1; ++i)
                data[data.size() - i].height = repeatHeight;
        }
    }

    if (opaqueData.size())
        painter->drawPixmapFragments(opaqueData.data(), opaqueData.size(), pixmap, QPainter::OpaqueHint);
    if (translucentData.size())
        painter->drawPixmapFragments(translucentData.data(), translucentData.size(), pixmap);

    if (oldAA)
        painter->setRenderHint(QPainter::Antialiasing, true);
}